

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

FunctionBody * __thiscall
TTD::ScriptContextTTD::ResolveParentBody(ScriptContextTTD *this,FunctionBody *body)

{
  FunctionBody **ppFVar1;
  FunctionBody *local_20;
  FunctionBody *local_18;
  FunctionBody *body_local;
  ScriptContextTTD *this_local;
  
  local_20 = (FunctionBody *)0x0;
  local_18 = body;
  body_local = (FunctionBody *)this;
  ppFVar1 = JsUtil::
            BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::LookupWithKey<Js::FunctionBody*>
                      ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->m_ttdFunctionBodyParentMap,&local_18,&local_20);
  return *ppFVar1;
}

Assistant:

Js::FunctionBody* ScriptContextTTD::ResolveParentBody(Js::FunctionBody* body) const
    {
        //Want to return null if this has no parent (or this is an internal function and we don't care about parents)
        return this->m_ttdFunctionBodyParentMap.LookupWithKey(body, nullptr);
    }